

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O3

TokenKind slang::parsing::LexerFacts::getSystemKeywordKind(string_view text)

{
  char *pcVar1;
  uint uVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint64_t uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  char *in_RSI;
  size_t in_RDI;
  long lVar17;
  size_type __rlen;
  undefined1 auVar18 [16];
  size_t pos;
  value_type *elements;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_len = in_RDI;
  local_40._M_str = in_RSI;
  uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &systemIdentifierKeywords,&local_40);
  lVar10 = DAT_00cb2b38;
  lVar9 = DAT_00cb2b30;
  uVar8 = DAT_00cb2b28;
  uVar14 = uVar13 >> (systemIdentifierKeywords & 0x3f);
  lVar15 = (uVar13 & 0xff) * 4;
  cVar4 = (&UNK_0092f4ac)[lVar15];
  cVar5 = (&UNK_0092f4ad)[lVar15];
  cVar6 = (&UNK_0092f4ae)[lVar15];
  bVar7 = (&UNK_0092f4af)[lVar15];
  uVar16 = 0;
  do {
    pcVar1 = (char *)(lVar9 + uVar14 * 0x10);
    bVar3 = pcVar1[0xf];
    auVar18[0] = -(*pcVar1 == cVar4);
    auVar18[1] = -(pcVar1[1] == cVar5);
    auVar18[2] = -(pcVar1[2] == cVar6);
    auVar18[3] = -(pcVar1[3] == bVar7);
    auVar18[4] = -(pcVar1[4] == cVar4);
    auVar18[5] = -(pcVar1[5] == cVar5);
    auVar18[6] = -(pcVar1[6] == cVar6);
    auVar18[7] = -(pcVar1[7] == bVar7);
    auVar18[8] = -(pcVar1[8] == cVar4);
    auVar18[9] = -(pcVar1[9] == cVar5);
    auVar18[10] = -(pcVar1[10] == cVar6);
    auVar18[0xb] = -(pcVar1[0xb] == bVar7);
    auVar18[0xc] = -(pcVar1[0xc] == cVar4);
    auVar18[0xd] = -(pcVar1[0xd] == cVar5);
    auVar18[0xe] = -(pcVar1[0xe] == cVar6);
    auVar18[0xf] = -(bVar3 == bVar7);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      lVar15 = lVar10 + uVar14 * 0x168;
      do {
        uVar2 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        lVar17 = (ulong)uVar2 * 0x18;
        if ((local_40._M_len == *(size_t *)(lVar15 + lVar17)) &&
           ((local_40._M_len == 0 ||
            (iVar11 = bcmp(local_40._M_str,*(void **)(lVar15 + 8 + lVar17),local_40._M_len),
            iVar11 == 0)))) {
          return *(TokenKind *)(lVar15 + lVar17 + 0x10);
        }
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar3) == 0) {
      return Unknown;
    }
    lVar15 = uVar14 + uVar16;
    uVar16 = uVar16 + 1;
    uVar14 = lVar15 + 1U & uVar8;
  } while (uVar16 <= uVar8);
  return Unknown;
}

Assistant:

TokenKind LexerFacts::getSystemKeywordKind(std::string_view text) {
    if (auto it = systemIdentifierKeywords.find(text); it != systemIdentifierKeywords.end())
        return it->second;
    return TokenKind::Unknown;
}